

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridAxisRegular.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::GridAxisRegular::GridAxisRegular
          (GridAxisRegular *this,KFLOAT64 InitialXi,KFLOAT64 FinalXi,KUINT16 PointsXi,
          KUINT8 InterleafFactor,KUINT8 AxisType,KDataStream *stream)

{
  KDataStream *stream_local;
  KUINT8 AxisType_local;
  KUINT8 InterleafFactor_local;
  KUINT16 PointsXi_local;
  KFLOAT64 FinalXi_local;
  KFLOAT64 InitialXi_local;
  GridAxisRegular *this_local;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__GridAxisRegular_00334cb8;
  this->m_f64DomainInitialXi = InitialXi;
  this->m_f64DomainFinalXi = FinalXi;
  this->m_ui16DomainPointsXi = PointsXi;
  this->m_ui8InterleafFactor = InterleafFactor;
  this->m_ui8AxisType = AxisType;
  KDataStream::operator>>(stream,&this->m_ui16NumPoints);
  KDataStream::operator>>(stream,&this->m_ui16InitialIndex);
  return;
}

Assistant:

GridAxisRegular::GridAxisRegular( KFLOAT64 InitialXi, KFLOAT64 FinalXi, KUINT16 PointsXi, KUINT8 InterleafFactor,
                                  KUINT8 AxisType, KDataStream & stream ) :
    m_f64DomainInitialXi( InitialXi ),
    m_f64DomainFinalXi( FinalXi ),
    m_ui16DomainPointsXi( PointsXi ),
    m_ui8InterleafFactor( InterleafFactor ),
    m_ui8AxisType( AxisType )
{
    // Decode the last 2 values.
    stream >> m_ui16NumPoints;
    stream >> m_ui16InitialIndex;
}